

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  CppType CVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  RepeatedField<int> *pRVar4;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar5;
  LogFinisher local_65;
  int value_local;
  LogMessage local_60;
  
  value_local = value;
  pVar5 = Insert(this,number);
  pEVar2 = pVar5.first;
  pEVar2->descriptor = descriptor;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar2->is_repeated == false) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x227);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                         );
      LogFinisher::operator=(&local_65,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    CVar1 = anon_unknown_26::cpp_type(pEVar2->type);
    if (CVar1 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x227);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_65,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    if (pEVar2->is_packed != packed) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x228);
      pLVar3 = LogMessage::operator<<
                         (&local_60,"CHECK failed: (extension->is_packed) == (packed): ");
      LogFinisher::operator=(&local_65,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
  }
  else {
    pEVar2->type = type;
    CVar1 = anon_unknown_26::cpp_type(type);
    if (CVar1 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x221);
      pLVar3 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_65,pLVar3);
      LogMessage::~LogMessage(&local_60);
    }
    pEVar2->is_repeated = true;
    pEVar2->is_packed = packed;
    pRVar4 = Arena::CreateMessageInternal<google::protobuf::RepeatedField<int>>(this->arena_);
    (pEVar2->field_0).repeated_int32_t_value = pRVar4;
  }
  RepeatedField<int>::Add((pEVar2->field_0).repeated_int32_t_value,&value_local);
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value =
        Arena::CreateMessage<RepeatedField<int>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}